

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_setlist(FuncState *fs,int base,int nelems,int tostore)

{
  int a;
  int local_28;
  int b;
  int c;
  int tostore_local;
  int nelems_local;
  int base_local;
  FuncState *fs_local;
  
  a = (nelems + -1) / 0x32 + 1;
  local_28 = tostore;
  if (tostore == -1) {
    local_28 = 0;
  }
  if (a < 0x200) {
    luaK_codeABC(fs,OP_SETLIST,base,local_28,a);
  }
  else {
    if (0x3ffffff < a) {
      luaX_syntaxerror(fs->ls,"constructor too long");
    }
    luaK_codeABC(fs,OP_SETLIST,base,local_28,0);
    codeextraarg(fs,a);
  }
  fs->freereg = (char)base + '\x01';
  return;
}

Assistant:

void luaK_setlist (FuncState *fs, int base, int nelems, int tostore) {
  int c =  (nelems - 1)/LFIELDS_PER_FLUSH + 1;
  int b = (tostore == LUA_MULTRET) ? 0 : tostore;
  lua_assert(tostore != 0);
  if (c <= MAXARG_C)
    luaK_codeABC(fs, OP_SETLIST, base, b, c);
  else if (c <= MAXARG_Ax) {
    luaK_codeABC(fs, OP_SETLIST, base, b, 0);
    codeextraarg(fs, c);
  }
  else
    luaX_syntaxerror(fs->ls, "constructor too long");
  fs->freereg = base + 1;  /* free registers with list values */
}